

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport_p.h
# Opt level: O2

void __thiscall KDReports::HeaderMap::~HeaderMap(HeaderMap *this)

{
  _Base_ptr this_00;
  iterator iVar1;
  iterator iVar2;
  
  iVar1._M_node =
       (_Base_ptr)
       QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::begin
                 (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
  while( true ) {
    iVar2 = QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::end
                      (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
    if ((iterator)iVar1._M_node == iVar2.i._M_node) break;
    this_00 = iVar1._M_node[1]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      Header::~Header((Header *)this_00);
    }
    operator_delete(this_00,8);
    iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*,_std::less<QFlags<KDReports::HeaderLocation>_>,_std::allocator<std::pair<const_QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>_>_>_>_>
              *)this);
  return;
}

Assistant:

~HeaderMap()
    {
        for (iterator it = begin(); it != end(); ++it) {
            delete *it;
        }
    }